

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cpp
# Opt level: O2

uint booster::ptime::sleep(uint __seconds)

{
  uint uVar1;
  int *piVar2;
  undefined4 in_register_0000003c;
  timespec ts;
  timespec tsr;
  timespec local_38;
  timespec local_20;
  
  local_38.tv_sec = *(__time_t *)CONCAT44(in_register_0000003c,__seconds);
  local_38.tv_nsec = (long)(int)((__time_t *)CONCAT44(in_register_0000003c,__seconds))[1];
  while( true ) {
    uVar1 = nanosleep(&local_38,&local_20);
    piVar2 = (int *)(ulong)uVar1;
    if (-1 < (int)uVar1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) break;
    local_38.tv_sec = local_20.tv_sec;
    local_38.tv_nsec = local_20.tv_nsec;
  }
  return (uint)piVar2;
}

Assistant:

void ptime::sleep(ptime const &p)
{
	#ifndef BOOSTER_WIN_NATIVE
	struct timespec ts,tsr;
	ts.tv_sec = p.sec;
	ts.tv_nsec = p.nsec;
	while(::nanosleep(&ts,&tsr) < 0 && errno==EINTR)
		ts=tsr;
	#else
	ptime n = now();
	ptime end = n + p;
	while(end > n) {
		::Sleep(DWORD(milliseconds(end - n)));
		n = now();
	}
	#endif
}